

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteSpotLight(ColladaExporter *this,aiLight *light)

{
  undefined1 *puVar1;
  string *psVar2;
  string *psVar3;
  float fVar4;
  ostream *poVar5;
  double dVar6;
  
  puVar1 = &this->field_0x38;
  psVar2 = &this->startstr;
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"<spot>");
  psVar3 = &this->endstr;
  std::operator<<(poVar5,(string *)psVar3);
  PushTag(this);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"<color sid=\"color\">");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(light->mColorDiffuse).r);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(light->mColorDiffuse).g);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(light->mColorDiffuse).b);
  poVar5 = std::operator<<(poVar5,"</color>");
  std::operator<<(poVar5,(string *)psVar3);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"<constant_attenuation>");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,light->mAttenuationConstant);
  poVar5 = std::operator<<(poVar5,"</constant_attenuation>");
  std::operator<<(poVar5,(string *)psVar3);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"<linear_attenuation>");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,light->mAttenuationLinear);
  poVar5 = std::operator<<(poVar5,"</linear_attenuation>");
  std::operator<<(poVar5,(string *)psVar3);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"<quadratic_attenuation>");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,light->mAttenuationQuadratic);
  poVar5 = std::operator<<(poVar5,"</quadratic_attenuation>");
  std::operator<<(poVar5,(string *)psVar3);
  fVar4 = light->mAngleInnerCone;
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"<falloff_angle sid=\"fall_off_angle\">");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar4 * 57.29578);
  poVar5 = std::operator<<(poVar5,"</falloff_angle>");
  std::operator<<(poVar5,(string *)psVar3);
  dVar6 = cos((double)(light->mAngleOuterCone - light->mAngleInnerCone));
  dVar6 = log(dVar6);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  std::operator<<(poVar5,"<falloff_exponent sid=\"fall_off_exponent\">");
  poVar5 = std::ostream::_M_insert<double>(1.0 / (dVar6 / -2.3025850929940455));
  poVar5 = std::operator<<(poVar5,"</falloff_exponent>");
  std::operator<<(poVar5,(string *)psVar3);
  PopTag(this);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"</spot>");
  std::operator<<(poVar5,(string *)psVar3);
  return;
}

Assistant:

void ColladaExporter::WriteSpotLight(const aiLight *const light){

    const aiColor3D &color=  light->mColorDiffuse;
    mOutput << startstr << "<spot>" << endstr;
    PushTag();
    mOutput << startstr << "<color sid=\"color\">"
                            << color.r<<" "<<color.g<<" "<<color.b
                        <<"</color>" << endstr;
    mOutput << startstr << "<constant_attenuation>"
                                << light->mAttenuationConstant
                            <<"</constant_attenuation>" << endstr;
    mOutput << startstr << "<linear_attenuation>"
                            << light->mAttenuationLinear
                        <<"</linear_attenuation>" << endstr;
    mOutput << startstr << "<quadratic_attenuation>"
                            << light->mAttenuationQuadratic
                        <<"</quadratic_attenuation>" << endstr;
    /*
    out->mAngleOuterCone = AI_DEG_TO_RAD (std::acos(std::pow(0.1f,1.f/srcLight->mFalloffExponent))+
                            srcLight->mFalloffAngle);
    */

    const ai_real fallOffAngle = AI_RAD_TO_DEG(light->mAngleInnerCone);
    mOutput << startstr <<"<falloff_angle sid=\"fall_off_angle\">"
                                << fallOffAngle
                        <<"</falloff_angle>" << endstr;
    double temp = light->mAngleOuterCone-light->mAngleInnerCone;

    temp = std::cos(temp);
    temp = std::log(temp)/std::log(0.1);
    temp = 1/temp;
    mOutput << startstr << "<falloff_exponent sid=\"fall_off_exponent\">"
                            << temp
                        <<"</falloff_exponent>" << endstr;


    PopTag();
    mOutput << startstr << "</spot>" << endstr;

}